

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

void * flatcc_builder_vector_push(flatcc_builder_t *B,void *data)

{
  uint uVar1;
  uint uVar2;
  __flatcc_builder_frame_t *p_Var3;
  int iVar4;
  void *pvVar5;
  uint uVar6;
  
  p_Var3 = B->frame;
  if (p_Var3->type != 4) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x3a0,"void *flatcc_builder_vector_push(flatcc_builder_t *, const void *)");
  }
  uVar1 = (p_Var3->container).table.pl_end;
  if (uVar1 <= (p_Var3->container).table.vt_hash) {
    (p_Var3->container).table.pl_end = uVar1 + 1;
    uVar1 = (B->frame->container).table.vs_end;
    uVar2 = B->ds_offset;
    uVar6 = uVar2 + uVar1;
    B->ds_offset = uVar6;
    if ((B->ds_limit <= uVar6) && (iVar4 = reserve_ds(B,(ulong)(uVar6 + 1),0xfffffffc), iVar4 != 0))
    {
      return (void *)0x0;
    }
    if (B->ds == (uint8_t *)0x0) {
      return (void *)0x0;
    }
    pvVar5 = memcpy(B->ds + uVar2,data,(ulong)uVar1);
    return pvVar5;
  }
  __assert_fail("(B->frame[0].container.vector.count) <= (B->frame[0].container.vector.max_count)",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x3a1,"void *flatcc_builder_vector_push(flatcc_builder_t *, const void *)");
}

Assistant:

void *flatcc_builder_vector_push(flatcc_builder_t *B, const void *data)
{
    check(frame(type) == flatcc_builder_vector, "expected vector frame");
    check_error(frame(container.vector.count) <= frame(container.vector.max_count), 0, "vector max count exceeded");
    frame(container.vector.count) += 1;
    return push_ds_copy(B, data, frame(container.vector.elem_size));
}